

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O0

void * myEmployeeCustomConstructor::ArchiveINconstructor(ChArchiveIn *marchive)

{
  double dVar1;
  myEmployeeCustomConstructor *this;
  ChNameValue<int> local_60;
  ChNameValue<double> local_38;
  int local_1c;
  double dStack_18;
  int kids;
  double latitude;
  ChArchiveIn *marchive_local;
  
  latitude = (double)marchive;
  chrono::ChArchiveIn::VersionRead<myEmployeeCustomConstructor>(marchive);
  dVar1 = latitude;
  chrono::make_ChNameValue<double>(&local_38,"latitude",&stack0xffffffffffffffe8,'\0');
  chrono::ChArchiveIn::operator>>((ChArchiveIn *)dVar1,&local_38);
  chrono::ChNameValue<double>::~ChNameValue(&local_38);
  dVar1 = latitude;
  chrono::make_ChNameValue<int>(&local_60,"kids",&local_1c,'\0');
  chrono::ChArchiveIn::operator>>((ChArchiveIn *)dVar1,&local_60);
  chrono::ChNameValue<int>::~ChNameValue(&local_60);
  this = (myEmployeeCustomConstructor *)operator_new(0x50);
  myEmployeeCustomConstructor(this,local_1c,dStack_18);
  return this;
}

Assistant:

static void* ArchiveINconstructor(ChArchiveIn& marchive)
    {
        // suggested: use versioning
        /*int version =*/ marchive.VersionRead<myEmployeeCustomConstructor>();

        // 1) Deserialize the parameters of the constructor:
        // you need some auxiliary variables because this method is static 
        // (the object will be created right after the >> parsing)
        // Note, be sure that the names of those auxiliary vars are the same of member 
        // variables of your class, or use  CHNVP(..., "myname") tags.
        double latitude;   
        int    kids;
        marchive >> CHNVP(latitude);
        marchive >> CHNVP(kids);

        // 2) Important!!! Finally you MUST return an object of this class, 
        // constructed with the parameters that you just deserialized:
        return new myEmployeeCustomConstructor(kids, latitude);
    }